

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O2

double trial::protocol::json::detail::power10<double>(int exponent)

{
  double dVar1;
  
  if ((uint)exponent < 0xb) {
    return *(double *)(&DAT_0010a7c0 + (ulong)(uint)exponent * 8);
  }
  dVar1 = pow(10.0,(double)exponent);
  return dVar1;
}

Assistant:

RealT power10(int exponent)
{
    switch (exponent)
    {
    case 0: return RealT(1.0);
    case 1: return RealT(1E1);
    case 2: return RealT(1E2);
    case 3: return RealT(1E3);
    case 4: return RealT(1E4);
    case 5: return RealT(1E5);
    case 6: return RealT(1E6);
    case 7: return RealT(1E7);
    case 8: return RealT(1E8);
    case 9: return RealT(1E9);
    case 10: return RealT(1E10);
    default: return std::pow(RealT(10), exponent);
    }
}